

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall
imrt::Plan::Plan(Plan *this,EvaluationFunction *ev,vector<double,_std::allocator<double>_> *w,
                vector<double,_std::allocator<double>_> *Zmin,
                vector<double,_std::allocator<double>_> *Zmax)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR__Plan_00186b28;
  std::
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  ::map((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
         *)0x15de37);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x15de4a);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15de5d);
  in_RDI[0xf] = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_RDI[0xb] = 0;
  return;
}

Assistant:

Plan::Plan(EvaluationFunction &ev, vector<double> w, vector<double> Zmin, vector<double> Zmax): ev(ev), w(w), Zmin(Zmin), Zmax(Zmax) {
    last_changed=NULL;
  }